

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O2

bool __thiscall ON_Brep::IsValidTopology(ON_Brep *this,ON_TextLog *text_log)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ON_BrepEdge *pOVar6;
  ON_BrepTrim *pOVar7;
  ON_BrepFace *pOVar8;
  char cVar9;
  bool bVar10;
  ON_Curve *pOVar11;
  ulong uVar12;
  int *piVar13;
  ON_Surface *pOVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  char *pcVar19;
  long *plVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  
  uVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count
  ;
  uVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  uVar3 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count;
  if ((uVar2 == 0 && uVar1 == 0) && uVar3 == 0) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    pcVar19 = "ON_Brep has no faces, edges, or vertices\n";
    goto LAB_004314d9;
  }
  uVar4 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count;
  uVar5 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count;
  if (uVar3 == 0) {
    if (uVar2 == 0) goto LAB_0043136e;
  }
  else {
    if (uVar2 == 0) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      pcVar19 = "ON_Brep has no edges.\n";
      goto LAB_004314d9;
    }
    if (uVar5 == 0) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      pcVar19 = "ON_Brep has no loops.\n";
      goto LAB_004314d9;
    }
    if ((this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count == 0) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      pcVar19 = "ON_Brep has no surfaces.\n";
      goto LAB_004314d9;
    }
    if (uVar4 == 0) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      pcVar19 = "ON_Brep has no trims.\n";
      goto LAB_004314d9;
    }
    if ((this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count == 0) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      pcVar19 = "ON_Brep has no 2d curves.\n";
      goto LAB_004314d9;
    }
  }
  if ((this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count == 0) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    pcVar19 = "ON_Brep has no 3d curves.\n";
  }
  else {
    if (uVar1 != 0) {
LAB_0043136e:
      uVar16 = 0;
      uVar23 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar23 = uVar16;
      }
      piVar13 = &((this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
                 .m_a)->m_vertex_index;
      for (; uVar23 != uVar16; uVar16 = uVar16 + 1) {
        uVar15 = (ulong)(uint)*piVar13;
        if (uVar15 == 0xffffffff) {
          if (0 < piVar13[5]) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_V[%d] is deleted (m_vertex_index = -1) but vertex.m_ei.Count() = %d.\n";
            goto LAB_004317e5;
          }
        }
        else if (uVar16 != uVar15) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar19 = "ON_Brep.m_V[%d].m_vertex_index = %d (should be %d)\n";
          uVar24 = uVar16;
          goto LAB_004316be;
        }
        piVar13 = piVar13 + 0x16;
      }
      uVar16 = 0;
      uVar22 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar22 = uVar16;
      }
      for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
        pOVar6 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
        uVar15 = (ulong)*(uint *)((long)pOVar6->m_vi + (uVar16 - 8));
        if (uVar15 == 0xffffffff) {
          if (0 < *(int *)((long)pOVar6->m_vi + uVar16 + 0x1c)) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_ei.Count() = %d.\n"
            ;
            goto LAB_004317e0;
          }
          if (*(int *)((long)pOVar6->m_vi + (uVar16 - 4)) != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_c3i=%d (should be -1).\n";
            goto LAB_004317e0;
          }
          pOVar11 = ON_CurveProxy::ProxyCurve
                              ((ON_CurveProxy *)
                               ((long)&(((ON_CurveProxy *)
                                        (&(pOVar6->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                       super_ON_Curve).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + uVar16));
          if (pOVar11 != (ON_Curve *)0x0) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_curve is not nullptr.\n";
            goto LAB_004316e1;
          }
          if (*(int *)((long)pOVar6->m_vi + uVar16) != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_vi[0]=%d (should be -1).\n";
            goto LAB_004317e0;
          }
          if (*(int *)((long)pOVar6->m_vi + uVar16 + 4) != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_vi[1]=%d (should be -1).\n";
            goto LAB_004317e0;
          }
        }
        else if (uVar24 != uVar15) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar19 = "ON_Brep.m_E[%d].m_edge_index = %d (should be %d)\n";
          goto LAB_004316b6;
        }
        uVar16 = uVar16 + 0x88;
      }
      uVar16 = 0;
      uVar12 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar12 = uVar16;
      }
      for (uVar24 = 0; uVar12 != uVar24; uVar24 = uVar24 + 1) {
        pOVar7 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
        uVar15 = (ulong)*(uint *)((long)pOVar7->m_vi + (uVar16 - 0xc));
        if (uVar15 == 0xffffffff) {
          if (*(int *)((long)pOVar7->m_vi + (uVar16 - 4)) != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_ei=%d (should be -1).\n";
            goto LAB_004317e0;
          }
          if (*(int *)((long)pOVar7->m_tolerance + (uVar16 - 4)) != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_li=%d (should be -1).\n";
            goto LAB_004317e0;
          }
          if (*(int *)((long)pOVar7->m_vi + (uVar16 - 8)) != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_c2i=%d (should be -1).\n";
            goto LAB_004317e0;
          }
          if (*(int *)((long)pOVar7->m_vi + uVar16) != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_vi[0]=%d (should be -1).\n";
            goto LAB_004317e0;
          }
          if (*(int *)((long)pOVar7->m_vi + uVar16 + 4) != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_vi[1]=%d (should be -1).\n";
            goto LAB_004317e0;
          }
        }
        else {
          if (uVar24 != uVar15) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = "ON_Brep.m_T[%d].m_trim_index = %d (should be %d)\n";
            goto LAB_004316b6;
          }
          plVar20 = (long *)((long)&(((ON_CurveProxy *)
                                     (&(pOVar7->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                    super_ON_Curve).super_ON_Geometry.super_ON_Object.
                                    _vptr_ON_Object + uVar16);
          cVar9 = (**(code **)(*plVar20 + 0x30))(plVar20,text_log);
          if (cVar9 == '\0') {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = "ON_Brep.m_T[%d] is not valid\n";
            goto LAB_004316e1;
          }
        }
        uVar16 = uVar16 + 0xe8;
      }
      uVar16 = 0;
      uVar21 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar21 = uVar16;
      }
      piVar13 = &((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
                 )->m_fi;
      for (; uVar21 != uVar16; uVar16 = uVar16 + 1) {
        uVar15 = (ulong)(uint)piVar13[-8];
        if (uVar15 == 0xffffffff) {
          if (*piVar13 != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_L[%d] is deleted (m_loop_index = -1) but loop.m_fi=%d (should be -1).\n";
            goto LAB_004317e5;
          }
          if (0 < piVar13[-3]) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = "ON_Brep.m_L[%d] is deleted (m_loop_index = -1) but loop.m_ti.Count()=%d.\n";
            goto LAB_004317e5;
          }
        }
        else if (uVar16 != uVar15) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar19 = "ON_Brep.m_L[%d].m_loop_index = %d (should be %d)\n";
          uVar24 = uVar16;
          goto LAB_004316be;
        }
        piVar13 = piVar13 + 0x1e;
      }
      uVar17 = 0;
      uVar16 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar16 = uVar17;
      }
      for (uVar24 = 0; uVar16 != uVar24; uVar24 = uVar24 + 1) {
        pOVar8 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
        uVar15 = (ulong)*(uint *)((pOVar8->m_face_uuid).Data4 + (uVar17 - 0x30));
        if (uVar15 == 0xffffffff) {
          if (*(int *)((pOVar8->m_face_uuid).Data4 + (uVar17 - 0x14)) != -1) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.m_si=%d (should be -1).\n";
LAB_004317e0:
            uVar16 = uVar24 & 0xffffffff;
LAB_004317e5:
            ON_TextLog::Print(text_log,pcVar19,uVar16);
            return false;
          }
          pOVar14 = ON_SurfaceProxy::ProxySurface
                              ((ON_SurfaceProxy *)((pOVar8->m_face_uuid).Data4 + (uVar17 - 0x5c)));
          if (pOVar14 != (ON_Surface *)0x0) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = 
            "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.ProxySurface() is not nullptr.\n"
            ;
            goto LAB_004316e1;
          }
          if (0 < *(int *)((pOVar8->m_face_uuid).Data4 + (uVar17 - 0x1c))) {
            if (text_log == (ON_TextLog *)0x0) {
              return false;
            }
            pcVar19 = "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.m_li.Count()=%d.\n";
            goto LAB_004317e0;
          }
        }
        else if (uVar24 != uVar15) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar19 = "ON_Brep.m_F[%d].m_face_index = %d (should be %d)\n";
LAB_004316b6:
          uVar16 = uVar24 & 0xffffffff;
LAB_004316be:
          ON_TextLog::Print(text_log,pcVar19,uVar16,uVar15,uVar24 & 0xffffffff);
          return false;
        }
        uVar17 = uVar17 + 0xd8;
      }
      lVar18 = 0x34;
      for (uVar24 = 0; uVar23 != uVar24; uVar24 = uVar24 + 1) {
        if ((*(int *)((long)&(((this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                               super_ON_ClassArray<ON_BrepVertex>.m_a)->super_ON_Point).
                             super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar18) != -1) &&
           (bVar10 = IsValidVertexTopology(this,(int)uVar24,text_log), !bVar10)) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar19 = "ON_Brep.m_V[%d] is invalid.\n";
          goto LAB_004316e1;
        }
        lVar18 = lVar18 + 0x58;
      }
      lVar18 = 0x4c;
      for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
        if ((*(int *)((long)&(((ON_CurveProxy *)
                              (&(((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                  super_ON_ClassArray<ON_BrepEdge>.m_a)->super_ON_CurveProxy).
                                m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                             super_ON_Object._vptr_ON_Object + lVar18) != -1) &&
           (bVar10 = IsValidEdgeTopology(this,(int)uVar24,text_log), !bVar10)) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar19 = "ON_Brep.m_E[%d] is invalid.\n";
          goto LAB_004316e1;
        }
        lVar18 = lVar18 + 0x88;
      }
      lVar18 = 0x2c;
      for (uVar24 = 0; uVar16 != uVar24; uVar24 = uVar24 + 1) {
        if ((*(int *)((((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                        super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 + lVar18 + -0x5c)
             != -1) && (bVar10 = IsValidFaceTopology(this,(int)uVar24,text_log), !bVar10)) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar19 = "ON_Brep.m_F[%d] is invalid.\n";
          goto LAB_004316e1;
        }
        lVar18 = lVar18 + 0xd8;
      }
      lVar18 = 0x4c;
      uVar24 = 0;
      do {
        if (uVar12 == uVar24) {
          lVar18 = 0x1c;
          uVar24 = 0;
          while( true ) {
            if (uVar21 == uVar24) {
              return true;
            }
            if ((*(int *)((long)&(((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                                   super_ON_ClassArray<ON_BrepLoop>.m_a)->super_ON_Geometry).
                                 super_ON_Object._vptr_ON_Object + lVar18) != -1) &&
               (bVar10 = IsValidLoopTopology(this,(int)uVar24,text_log), !bVar10)) break;
            uVar24 = uVar24 + 1;
            lVar18 = lVar18 + 0x78;
          }
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar19 = "ON_Brep.m_L[%d] is invalid.\n";
LAB_004316e1:
          ON_TextLog::Print(text_log,pcVar19,uVar24 & 0xffffffff);
          return false;
        }
        if ((*(int *)((long)&(((ON_CurveProxy *)
                              (&(((this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                  super_ON_ClassArray<ON_BrepTrim>.m_a)->super_ON_CurveProxy).
                                m_real_curve_domain + -2))->super_ON_Curve).super_ON_Geometry.
                             super_ON_Object._vptr_ON_Object + lVar18) != -1) &&
           (bVar10 = IsValidTrimTopology(this,(int)uVar24,text_log), !bVar10)) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          pcVar19 = "ON_Brep.m_T[%d] is invalid.\n";
          goto LAB_004316e1;
        }
        uVar24 = uVar24 + 1;
        lVar18 = lVar18 + 0xe8;
      } while( true );
    }
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    pcVar19 = "ON_Brep has no vertices.\n";
  }
LAB_004314d9:
  ON_TextLog::Print(text_log,pcVar19);
  return false;
}

Assistant:

bool
ON_Brep::IsValidTopology( ON_TextLog* text_log ) const
{
  const int curve2d_count = m_C2.Count();
  const int curve3d_count = m_C3.Count();
  const int surface_count = m_S.Count();
  const int vertex_count  = m_V.Count();
  const int edge_count    = m_E.Count();
  const int trim_count    = m_T.Count();
  const int loop_count    = m_L.Count();
  const int face_count    = m_F.Count();

  int vi, ei, fi, ti, li;

  if ( 0 == face_count && 0 == edge_count && 0 == vertex_count )
  {
    if ( text_log )
      text_log->Print( "ON_Brep has no faces, edges, or vertices\n");
    return false;
  }

  if ( 0 != face_count )
  {
    if ( 0 == edge_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no edges.\n");
      return false;
    }
    if ( 0 == loop_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no loops.\n");
      return false;
    }
    if ( 0 == surface_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no surfaces.\n");
      return false;
    }
    if ( 0 == trim_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no trims.\n");
      return false;
    }
    if ( 0 == curve2d_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no 2d curves.\n");
      return false;
    }
  }

  if ( 0 != edge_count )
  {
    if ( 0 == curve3d_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no 3d curves.\n");
      return false;
    }
    if ( 0 == vertex_count )
    {
      if ( text_log )
        text_log->Print( "ON_Brep has no vertices.\n");
      return false;
    }
  }

  // check element indices match array positions
  for ( vi = 0; vi < vertex_count; vi++ ) 
  {
    if ( m_V[vi].m_vertex_index == -1 )
    {
      const ON_BrepVertex& vertex = m_V[vi];
      if ( vertex.m_ei.Count() > 0 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_V[%d] is deleted (m_vertex_index = -1) but vertex.m_ei.Count() = %d.\n",
                           vi, vertex.m_ei.Count() );
        return false;
      }
    }
    else if ( m_V[vi].m_vertex_index != vi )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_V[%d].m_vertex_index = %d (should be %d)\n",
                         vi, m_V[vi].m_vertex_index, vi );
      return false;
    }
  }

  for ( ei = 0; ei < edge_count; ei++ ) 
  {
    if ( m_E[ei].m_edge_index == -1 )
    {
      const ON_BrepEdge& edge = m_E[ei];
      if ( edge.m_ti.Count() > 0 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_ei.Count() = %d.\n",
                           ei, edge.m_ti.Count() );
        return false;
      }
      if ( edge.m_c3i != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_c3i=%d (should be -1).\n",
                           ei, edge.m_c3i );
        return false;
      }
      if ( edge.ProxyCurve() )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_curve is not nullptr.\n",
                           ei );
        return false;
      }
      if ( edge.m_vi[0] != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_vi[0]=%d (should be -1).\n",
                           ei, edge.m_vi[0] );
        return false;
      }
      if ( edge.m_vi[1] != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_E[%d] is deleted (m_edge_index = -1) but edge.m_vi[1]=%d (should be -1).\n",
                           ei, edge.m_vi[1] );
        return false;
      }
    }
    else if ( m_E[ei].m_edge_index != ei )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_E[%d].m_edge_index = %d (should be %d)\n",
                         ei, m_E[ei].m_edge_index, ei );
      return false;
    }
  }

  for ( ti = 0; ti < trim_count; ti++ ) 
  {
    if ( m_T[ti].m_trim_index == -1 )
    {
      const ON_BrepTrim& trim = m_T[ti];
      if ( trim.m_ei != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_ei=%d (should be -1).\n",
                           ti, trim.m_ei );
        return false;
      }
      if ( trim.m_li != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_li=%d (should be -1).\n",
                           ti, trim.m_li );
        return false;
      }
      if ( trim.m_c2i != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_c2i=%d (should be -1).\n",
                           ti, trim.m_c2i );
        return false;
      }
      if ( trim.m_vi[0] != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_vi[0]=%d (should be -1).\n",
                           ti, trim.m_vi[0] );
        return false;
      }
      if ( trim.m_vi[1] != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_T[%d] is deleted (m_trim_index = -1) but trim.m_vi[1]=%d (should be -1).\n",
                           ti, trim.m_vi[1] );
        return false;
      }
    }
    else if ( m_T[ti].m_trim_index != ti  )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_T[%d].m_trim_index = %d (should be %d)\n",
                         ti, m_T[ti].m_trim_index, ti );
      return false;
    }
    else if ( !m_T[ti].IsValid( text_log ) )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_T[%d] is not valid\n",ti );
      return false;
    }
  }

  for ( li = 0; li < loop_count; li++ ) 
  {
    if ( m_L[li].m_loop_index == -1 )
    {
      const ON_BrepLoop& loop = m_L[li];
      if ( loop.m_fi != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_L[%d] is deleted (m_loop_index = -1) but loop.m_fi=%d (should be -1).\n",
                           li, loop.m_fi );
        return false;
      }
      if ( loop.m_ti.Count() > 0 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_L[%d] is deleted (m_loop_index = -1) but loop.m_ti.Count()=%d.\n",
                           li, loop.m_ti.Count() );
        return false;
      }
    }
    else if ( m_L[li].m_loop_index != li )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_L[%d].m_loop_index = %d (should be %d)\n",
                         li, m_L[li].m_loop_index, li );
      return false;
    }
  }

  for ( fi = 0; fi < face_count; fi++ ) 
  {
    if ( m_F[fi].m_face_index == -1 )
    {
      const ON_BrepFace& face = m_F[fi];
      if ( face.m_si != -1 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.m_si=%d (should be -1).\n",
                           fi, face.m_si );
        return false;
      }
      if ( face.ProxySurface() )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.ProxySurface() is not nullptr.\n",
                           fi );
        return false;
      }
      if ( face.m_li.Count() > 0 )
      {
        if ( text_log )
          text_log->Print( "ON_Brep.m_F[%d] is deleted (m_face_index = -1) but face.m_li.Count()=%d.\n",
                           fi, face.m_li.Count() );
        return false;
      }
    }
    else if ( m_F[fi].m_face_index != fi )
    {
      if ( text_log )
        text_log->Print( "ON_Brep.m_F[%d].m_face_index = %d (should be %d)\n",
                         fi, m_F[fi].m_face_index, fi );
      return false;
    }
  }

  // check vertices
  for ( vi = 0; vi < vertex_count; vi++ ) {
    if ( m_V[vi].m_vertex_index == -1 )
      continue;
    if ( !IsValidVertexTopology( vi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_V[%d] is invalid.\n",vi);
      return false;
    }
  }

  // check edges
  for ( ei = 0; ei < edge_count; ei++ ) 
  {
    if ( m_E[ei].m_edge_index == -1 )
      continue;
    if ( !IsValidEdgeTopology( ei, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_E[%d] is invalid.\n",ei);
      return false;
    }
  }

  // check faces
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    if ( m_F[fi].m_face_index == -1 )
      continue;
    if ( !IsValidFaceTopology( fi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_F[%d] is invalid.\n",fi);
      return false;
    }
  }

  // check trims
  for ( ti = 0; ti < trim_count; ti++ )
  {
    const ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_trim_index == -1 )
      continue;
    if ( !IsValidTrimTopology( ti, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_T[%d] is invalid.\n",ti);
      return false;
    }
  }

  // check loops
  for ( li = 0; li < loop_count; li++ )
  {
    const ON_BrepLoop& loop = m_L[li];
    if ( loop.m_loop_index == -1 )
      continue;
    if ( !IsValidLoopTopology( li, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d] is invalid.\n",li);
      return false;
    }
  }

  return true;
}